

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O0

UBool calendar_chinese_cleanup(void)

{
  CalendarAstronomer *this;
  void *in_RSI;
  
  this = gChineseCalendarAstro;
  if (gChineseCalendarAstro != (CalendarAstronomer *)0x0) {
    if (gChineseCalendarAstro != (CalendarAstronomer *)0x0) {
      icu_63::CalendarAstronomer::~CalendarAstronomer(gChineseCalendarAstro);
      icu_63::UMemory::operator_delete((UMemory *)this,in_RSI);
    }
    gChineseCalendarAstro = (CalendarAstronomer *)0x0;
  }
  if (gChineseCalendarWinterSolsticeCache != (CalendarCache *)0x0) {
    if (gChineseCalendarWinterSolsticeCache != (CalendarCache *)0x0) {
      (*gChineseCalendarWinterSolsticeCache->_vptr_CalendarCache[1])();
    }
    gChineseCalendarWinterSolsticeCache = (CalendarCache *)0x0;
  }
  if (gChineseCalendarNewYearCache != (CalendarCache *)0x0) {
    if (gChineseCalendarNewYearCache != (CalendarCache *)0x0) {
      (*gChineseCalendarNewYearCache->_vptr_CalendarCache[1])();
    }
    gChineseCalendarNewYearCache = (CalendarCache *)0x0;
  }
  if (gChineseCalendarZoneAstroCalc != (TimeZone *)0x0) {
    if (gChineseCalendarZoneAstroCalc != (TimeZone *)0x0) {
      (*(gChineseCalendarZoneAstroCalc->super_UObject)._vptr_UObject[1])();
    }
    gChineseCalendarZoneAstroCalc = (TimeZone *)0x0;
  }
  icu_63::UInitOnce::reset(&gChineseCalendarZoneAstroCalcInitOnce);
  return '\x01';
}

Assistant:

U_CDECL_BEGIN
static UBool calendar_chinese_cleanup(void) {
    if (gChineseCalendarAstro) {
        delete gChineseCalendarAstro;
        gChineseCalendarAstro = NULL;
    }
    if (gChineseCalendarWinterSolsticeCache) {
        delete gChineseCalendarWinterSolsticeCache;
        gChineseCalendarWinterSolsticeCache = NULL;
    }
    if (gChineseCalendarNewYearCache) {
        delete gChineseCalendarNewYearCache;
        gChineseCalendarNewYearCache = NULL;
    }
    if (gChineseCalendarZoneAstroCalc) {
        delete gChineseCalendarZoneAstroCalc;
        gChineseCalendarZoneAstroCalc = NULL;
    }
    gChineseCalendarZoneAstroCalcInitOnce.reset();
    return TRUE;
}